

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O3

void secp256k1_ecmult(secp256k1_gej *r,secp256k1_gej *a,secp256k1_scalar *na,secp256k1_scalar *ng)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  bool bVar106;
  secp256k1_gej *psVar107;
  uint64_t uVar108;
  uint64_t uVar109;
  undefined4 in_EAX;
  int iVar110;
  uint uVar111;
  uint uVar112;
  ulong uVar113;
  long lVar114;
  ulong uVar115;
  ulong uVar116;
  ulong uVar117;
  secp256k1_ge *psVar118;
  secp256k1_fe *psVar119;
  secp256k1_ge *psVar120;
  secp256k1_gej *in_R8;
  ulong uVar121;
  ulong uVar122;
  long lVar123;
  long lVar124;
  uint uVar125;
  byte bVar126;
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  uint64_t tmp3;
  secp256k1_fe Z;
  uint64_t tmp3_1;
  uint64_t tmp2_1;
  uint64_t tmp1_1;
  secp256k1_fe aux [8];
  secp256k1_ge pre_a [8];
  int wnaf_ng_128 [129];
  int wnaf_ng_1 [129];
  secp256k1_strauss_point_state ps [1];
  long local_d68;
  undefined1 local_d58 [64];
  long lStack_d18;
  uint64_t local_d10;
  int local_d08;
  long local_d00;
  secp256k1_scalar *local_cf8;
  secp256k1_gej *local_cf0;
  undefined1 local_ce8 [16];
  ulong uStack_cd8;
  undefined1 local_cd0 [16];
  undefined1 local_ca8 [16];
  undefined1 local_c98 [16];
  undefined1 local_c88 [32];
  secp256k1_ge local_c68 [3];
  secp256k1_ge local_b28 [7];
  uint uStack_86c;
  secp256k1_scalar local_868 [16];
  uint uStack_65c;
  secp256k1_fe local_658 [13];
  uint auStack_44c [129];
  uint auStack_248 [130];
  uint local_40;
  uint local_3c;
  
  bVar126 = 0;
  local_ce8._0_8_ = 1;
  stack0xfffffffffffff320 = (undefined1  [16])0x0;
  local_cd0 = (undefined1  [16])0x0;
  auVar127 = *(undefined1 (*) [16])(na->d + 2) | *(undefined1 (*) [16])na->d;
  auVar128._0_4_ = -(uint)(auVar127._0_4_ == 0);
  auVar128._4_4_ = -(uint)(auVar127._4_4_ == 0);
  auVar128._8_4_ = -(uint)(auVar127._8_4_ == 0);
  auVar128._12_4_ = -(uint)(auVar127._12_4_ == 0);
  iVar110 = movmskps(in_EAX,auVar128);
  local_cf0 = r;
  if ((iVar110 == 0xf) || (a->infinity != 0)) {
    local_d68 = 0;
    local_d00 = 0;
    uVar125 = 0;
    bVar106 = false;
  }
  else {
    local_cf8 = ng;
    secp256k1_scalar_split_lambda(local_868,(secp256k1_scalar *)local_d58,na);
    local_40 = secp256k1_ecmult_wnaf((int *)(auStack_44c + 1),0x81,local_868,5);
    uVar112 = secp256k1_ecmult_wnaf((int *)(auStack_248 + 1),0x81,(secp256k1_scalar *)local_d58,5);
    local_d00 = (long)(int)local_40;
    uVar111 = uVar112;
    if ((int)uVar112 < (int)local_40) {
      uVar111 = local_40;
    }
    psVar119 = local_658;
    local_3c = uVar112;
    for (lVar123 = 0x10; lVar123 != 0; lVar123 = lVar123 + -1) {
      psVar119->n[0] = (a->x).n[0];
      a = (secp256k1_gej *)((long)a + (ulong)bVar126 * -0x10 + 8);
      psVar119 = (secp256k1_fe *)((long)psVar119 + ((ulong)bVar126 * -2 + 1) * 8);
    }
    psVar118 = local_b28;
    secp256k1_ecmult_odd_multiples_table
              ((int)psVar118,local_c68,(secp256k1_fe *)local_ce8,local_658,in_R8);
    secp256k1_ge_table_set_globalz(8,psVar118,&local_c68[0].x);
    lVar123 = 0;
    do {
      uVar117 = (psVar118->x).n[0];
      uVar122 = (psVar118->x).n[1];
      uVar1 = (psVar118->x).n[2];
      uVar2 = (psVar118->x).n[3];
      uVar3 = (psVar118->x).n[4];
      auVar39._8_8_ = 0;
      auVar39._0_8_ = uVar2;
      auVar40._8_8_ = 0;
      auVar40._0_8_ = uVar1;
      auVar41._8_8_ = 0;
      auVar41._0_8_ = uVar122;
      auVar42._8_8_ = 0;
      auVar42._0_8_ = uVar117;
      auVar43._8_8_ = 0;
      auVar43._0_8_ = uVar3;
      uVar113 = SUB168(ZEXT816(0x7ae96a2b657c) * auVar43,0);
      auVar127._8_8_ = 0;
      auVar127._0_8_ = uVar113 & 0xfffffffffffff;
      auVar127 = ZEXT816(0x7512f58995c13) * auVar40 + ZEXT816(0x96c28719501ee) * auVar39 +
                 ZEXT816(0xc3434e99cf049) * auVar41 + ZEXT816(0x7106e64479ea) * auVar42 +
                 auVar127 * ZEXT816(0x1000003d10);
      uVar115 = auVar127._0_8_;
      local_658[0].n[0] = uVar115 & 0xfffffffffffff;
      auVar91._8_8_ = 0;
      auVar91._0_8_ = uVar115 >> 0x34 | auVar127._8_8_ << 0xc;
      auVar44._8_8_ = 0;
      auVar44._0_8_ = uVar3;
      auVar45._8_8_ = 0;
      auVar45._0_8_ = uVar2;
      auVar46._8_8_ = 0;
      auVar46._0_8_ = uVar1;
      auVar47._8_8_ = 0;
      auVar47._0_8_ = uVar122;
      auVar48._8_8_ = 0;
      auVar48._0_8_ = uVar117;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = uVar113 >> 0x34 | SUB168(ZEXT816(0x7ae96a2b657c) * auVar43,8) << 0xc;
      auVar127 = ZEXT816(0x96c28719501ee) * auVar44 + auVar91 + ZEXT816(0x7512f58995c13) * auVar45 +
                 ZEXT816(0xc3434e99cf049) * auVar46 + ZEXT816(0x7106e64479ea) * auVar47 +
                 ZEXT816(0x7ae96a2b657c) * auVar48 + auVar5 * ZEXT816(0x1000003d10);
      uVar113 = auVar127._0_8_;
      auVar92._8_8_ = 0;
      auVar92._0_8_ = uVar113 >> 0x34 | auVar127._8_8_ << 0xc;
      local_d58._0_8_ = (uVar113 & 0xfffffffffffff) >> 0x30;
      local_868[0].d[0] = uVar113 & 0xffffffffffff;
      auVar49._8_8_ = 0;
      auVar49._0_8_ = uVar117;
      auVar50._8_8_ = 0;
      auVar50._0_8_ = uVar3;
      auVar51._8_8_ = 0;
      auVar51._0_8_ = uVar2;
      auVar52._8_8_ = 0;
      auVar52._0_8_ = uVar1;
      auVar53._8_8_ = 0;
      auVar53._0_8_ = uVar122;
      auVar127 = ZEXT816(0x7512f58995c13) * auVar50 + auVar92 + ZEXT816(0xc3434e99cf049) * auVar51 +
                 ZEXT816(0x7106e64479ea) * auVar52 + ZEXT816(0x7ae96a2b657c) * auVar53;
      uVar113 = auVar127._0_8_;
      auVar94._8_8_ = 0;
      auVar94._0_8_ = uVar113 >> 0x34 | auVar127._8_8_ << 0xc;
      auVar54._8_8_ = 0;
      auVar54._0_8_ = (uVar113 & 0xfffffffffffff) << 4 | local_d58._0_8_;
      auVar127 = ZEXT816(0x96c28719501ee) * auVar49 + ZEXT816(0x1000003d1) * auVar54;
      uVar113 = auVar127._0_8_;
      *(ulong *)((long)local_c68[0].x.n + lVar123) = uVar113 & 0xfffffffffffff;
      auVar93._8_8_ = 0;
      auVar93._0_8_ = uVar113 >> 0x34 | auVar127._8_8_ << 0xc;
      auVar55._8_8_ = 0;
      auVar55._0_8_ = uVar122;
      auVar56._8_8_ = 0;
      auVar56._0_8_ = uVar117;
      auVar57._8_8_ = 0;
      auVar57._0_8_ = uVar3;
      auVar58._8_8_ = 0;
      auVar58._0_8_ = uVar2;
      auVar59._8_8_ = 0;
      auVar59._0_8_ = uVar1;
      auVar128 = ZEXT816(0xc3434e99cf049) * auVar57 + auVar94 + ZEXT816(0x7106e64479ea) * auVar58 +
                 ZEXT816(0x7ae96a2b657c) * auVar59;
      uVar113 = auVar128._0_8_;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = uVar113 & 0xfffffffffffff;
      auVar127 = ZEXT816(0x96c28719501ee) * auVar55 + auVar93 + ZEXT816(0x7512f58995c13) * auVar56 +
                 auVar6 * ZEXT816(0x1000003d10);
      uVar115 = auVar127._0_8_;
      auVar96._8_8_ = 0;
      auVar96._0_8_ = uVar113 >> 0x34 | auVar128._8_8_ << 0xc;
      *(ulong *)((long)local_c68[0].x.n + lVar123 + 8) = uVar115 & 0xfffffffffffff;
      uVar109 = local_658[0].n[0];
      uVar108 = local_868[0].d[0];
      auVar95._8_8_ = 0;
      auVar95._0_8_ = uVar115 >> 0x34 | auVar127._8_8_ << 0xc;
      auVar60._8_8_ = 0;
      auVar60._0_8_ = uVar1;
      auVar61._8_8_ = 0;
      auVar61._0_8_ = uVar122;
      auVar62._8_8_ = 0;
      auVar62._0_8_ = uVar117;
      auVar63._8_8_ = 0;
      auVar63._0_8_ = uVar3;
      auVar64._8_8_ = 0;
      auVar64._0_8_ = uVar2;
      auVar128 = ZEXT816(0x7106e64479ea) * auVar63 + auVar96 + ZEXT816(0x7ae96a2b657c) * auVar64;
      uVar117 = auVar128._0_8_;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = uVar117 & 0xfffffffffffff;
      auVar127 = ZEXT816(0x96c28719501ee) * auVar60 + auVar95 + ZEXT816(0x7512f58995c13) * auVar61 +
                 ZEXT816(0xc3434e99cf049) * auVar62 + auVar7 * ZEXT816(0x1000003d10);
      uVar122 = auVar127._0_8_;
      *(ulong *)((long)local_c68[0].x.n + lVar123 + 0x10) = uVar122 & 0xfffffffffffff;
      auVar97._8_8_ = 0;
      auVar97._0_8_ = (uVar122 >> 0x34 | auVar127._8_8_ << 0xc) + uVar109;
      auVar8._8_8_ = 0;
      auVar8._0_8_ = uVar117 >> 0x34 | auVar128._8_8_ << 0xc;
      auVar97 = auVar8 * ZEXT816(0x1000003d10) + auVar97;
      uVar117 = auVar97._0_8_;
      *(ulong *)((long)local_c68[0].x.n + lVar123 + 0x18) = uVar117 & 0xfffffffffffff;
      *(ulong *)((long)local_c68[0].x.n + lVar123 + 0x20) =
           (uVar117 >> 0x34 | auVar97._8_8_ << 0xc) + uVar108;
      lVar123 = lVar123 + 0x28;
      psVar118 = psVar118 + 1;
    } while (lVar123 != 0x140);
    uVar125 = 0;
    if (0 < (int)uVar111) {
      uVar125 = uVar111;
    }
    local_d68 = (long)(int)uVar112;
    bVar106 = true;
    ng = local_cf8;
  }
  if (ng == (secp256k1_scalar *)0x0) {
    lVar123 = 0;
    lVar124 = 0;
  }
  else {
    local_c88._0_8_ = ng->d[0];
    local_c88._8_8_ = ng->d[1];
    local_c88._16_16_ = (undefined1  [16])0x0;
    local_ca8 = *(undefined1 (*) [16])(ng->d + 2);
    local_c98 = (undefined1  [16])0x0;
    uVar111 = secp256k1_ecmult_wnaf((int *)local_658,0x81,(secp256k1_scalar *)local_c88,0xf);
    uVar112 = secp256k1_ecmult_wnaf((int *)local_868,0x81,(secp256k1_scalar *)local_ca8,0xf);
    if ((int)uVar125 < (int)uVar111) {
      uVar125 = uVar111;
    }
    if ((int)uVar125 < (int)uVar112) {
      uVar125 = uVar112;
    }
    lVar124 = (long)(int)uVar112;
    lVar123 = (long)(int)uVar111;
  }
  psVar107 = local_cf0;
  local_cf0->infinity = 1;
  (psVar107->x).n[0] = 0;
  (psVar107->x).n[1] = 0;
  (psVar107->x).n[2] = 0;
  (psVar107->x).n[3] = 0;
  *(undefined1 (*) [16])((local_cf0->x).n + 4) = (undefined1  [16])0x0;
  (psVar107->y).n[1] = 0;
  (psVar107->y).n[2] = 0;
  (psVar107->y).n[3] = 0;
  (psVar107->y).n[4] = 0;
  (psVar107->z).n[0] = 0;
  (psVar107->z).n[1] = 0;
  (psVar107->z).n[2] = 0;
  (psVar107->z).n[3] = 0;
  (local_cf0->z).n[4] = 0;
  if (uVar125 != 0) {
    uVar117 = (ulong)uVar125;
    do {
      if (psVar107->infinity == 0) {
        secp256k1_gej_double(psVar107,psVar107);
      }
      else {
        psVar107->infinity = 1;
        (psVar107->x).n[0] = 0;
        (psVar107->x).n[1] = 0;
        (psVar107->x).n[2] = 0;
        (psVar107->x).n[3] = 0;
        *(undefined1 (*) [16])((psVar107->x).n + 4) = (undefined1  [16])0x0;
        (psVar107->y).n[1] = 0;
        (psVar107->y).n[2] = 0;
        (psVar107->y).n[3] = 0;
        (psVar107->y).n[4] = 0;
        (psVar107->z).n[0] = 0;
        (psVar107->z).n[1] = 0;
        (psVar107->z).n[2] = 0;
        (psVar107->z).n[3] = 0;
        (psVar107->z).n[4] = 0;
      }
      if (bVar106) {
        if (((long)uVar117 <= local_d00) && (uVar125 = auStack_44c[uVar117], uVar125 != 0)) {
          if ((int)uVar125 < 1) {
            psVar118 = local_b28 + (~uVar125 >> 1);
            psVar120 = (secp256k1_ge *)local_d58;
            for (lVar114 = 0xb; lVar114 != 0; lVar114 = lVar114 + -1) {
              (psVar120->x).n[0] = (psVar118->x).n[0];
              psVar118 = (secp256k1_ge *)((long)psVar118 + ((ulong)bVar126 * -2 + 1) * 8);
              psVar120 = (secp256k1_ge *)((long)psVar120 + (ulong)bVar126 * -0x10 + 8);
            }
            local_d58._40_8_ = 0x3ffffbfffff0bc - local_d58._40_8_;
            local_d58._48_8_ = 0x3ffffffffffffc - local_d58._48_8_;
            lVar114 = local_d58._56_8_;
            lStack_d18 = 0x3ffffffffffffc - local_d58._64_8_;
            local_d58._56_8_ = 0x3ffffffffffffc - lVar114;
            local_d10 = 0x3fffffffffffc - local_d10;
          }
          else {
            psVar118 = local_b28 + (uVar125 - 1 >> 1);
            psVar120 = (secp256k1_ge *)local_d58;
            for (lVar114 = 0xb; lVar114 != 0; lVar114 = lVar114 + -1) {
              (psVar120->x).n[0] = (psVar118->x).n[0];
              psVar118 = (secp256k1_ge *)((long)psVar118 + ((ulong)bVar126 * -2 + 1) * 8);
              psVar120 = (secp256k1_ge *)((long)psVar120 + (ulong)bVar126 * -0x10 + 8);
            }
          }
          secp256k1_gej_add_ge_var(psVar107,psVar107,(secp256k1_ge *)local_d58,(secp256k1_fe *)0x0);
        }
        if (((long)uVar117 <= local_d68) && (uVar125 = auStack_248[uVar117], uVar125 != 0)) {
          local_d08 = 0;
          if ((int)uVar125 < 1) {
            uVar122 = (ulong)(~uVar125 >> 1);
            local_d58._32_8_ = (&local_c68[0].y)[uVar122 - 1].n[4];
            local_d58._0_8_ = (&local_c68[0].x)[uVar122].n[0];
            local_d58._8_8_ = (&local_c68[0].x)[uVar122].n[1];
            local_d58._16_8_ = (&local_c68[0].x)[uVar122].n[2];
            local_d58._24_8_ = (&local_c68[0].y)[uVar122 - 1].n[3];
            local_d58._40_8_ = 0x3ffffbfffff0bc - local_b28[uVar122].y.n[0];
            local_d58._48_8_ = 0x3ffffffffffffc - local_b28[uVar122].y.n[1];
            lStack_d18 = 0x3ffffffffffffc - local_b28[uVar122].y.n[3];
            local_d58._56_8_ = 0x3ffffffffffffc - local_b28[uVar122].y.n[2];
            local_d10 = 0x3fffffffffffc - local_b28[uVar122].y.n[4];
          }
          else {
            uVar122 = (ulong)(uVar125 - 1 >> 1);
            local_d58._32_8_ = (&local_c68[0].y)[uVar122 - 1].n[4];
            local_d58._0_8_ = (&local_c68[0].x)[uVar122].n[0];
            local_d58._8_8_ = (&local_c68[0].x)[uVar122].n[1];
            local_d58._16_8_ = (&local_c68[0].x)[uVar122].n[2];
            local_d58._24_8_ = (&local_c68[0].y)[uVar122 - 1].n[3];
            local_d10 = local_b28[uVar122].y.n[4];
            local_d58._40_8_ = local_b28[uVar122].y.n[0];
            local_d58._48_8_ = local_b28[uVar122].y.n[1];
            unique0x00006c80 = *(undefined1 (*) [16])(local_b28[uVar122].y.n + 2);
          }
          secp256k1_gej_add_ge_var(psVar107,psVar107,(secp256k1_ge *)local_d58,(secp256k1_fe *)0x0);
        }
      }
      if (((long)uVar117 <= lVar123) && (uVar125 = (&uStack_65c)[uVar117], uVar125 != 0)) {
        if ((int)uVar125 < 1) {
          secp256k1_ge_from_storage((secp256k1_ge *)local_d58,secp256k1_pre_g + (~uVar125 >> 1));
          local_d58._40_8_ = 0x3ffffbfffff0bc - local_d58._40_8_;
          local_d58._48_8_ = 0x3ffffffffffffc - local_d58._48_8_;
          lVar114 = local_d58._56_8_;
          lStack_d18 = 0x3ffffffffffffc - local_d58._64_8_;
          local_d58._56_8_ = 0x3ffffffffffffc - lVar114;
          local_d10 = 0x3fffffffffffc - local_d10;
        }
        else {
          secp256k1_ge_from_storage((secp256k1_ge *)local_d58,secp256k1_pre_g + (uVar125 - 1 >> 1));
        }
        secp256k1_gej_add_zinv_var
                  (psVar107,psVar107,(secp256k1_ge *)local_d58,(secp256k1_fe *)local_ce8);
      }
      if (((long)uVar117 <= lVar124) && (uVar125 = (&uStack_86c)[uVar117], uVar125 != 0)) {
        if ((int)uVar125 < 1) {
          secp256k1_ge_from_storage((secp256k1_ge *)local_d58,secp256k1_pre_g_128 + (~uVar125 >> 1))
          ;
          local_d58._40_8_ = 0x3ffffbfffff0bc - local_d58._40_8_;
          local_d58._48_8_ = 0x3ffffffffffffc - local_d58._48_8_;
          lVar114 = local_d58._56_8_;
          lStack_d18 = 0x3ffffffffffffc - local_d58._64_8_;
          local_d58._56_8_ = 0x3ffffffffffffc - lVar114;
          local_d10 = 0x3fffffffffffc - local_d10;
        }
        else {
          secp256k1_ge_from_storage
                    ((secp256k1_ge *)local_d58,secp256k1_pre_g_128 + (uVar125 - 1 >> 1));
        }
        secp256k1_gej_add_zinv_var
                  (psVar107,psVar107,(secp256k1_ge *)local_d58,(secp256k1_fe *)local_ce8);
      }
      bVar4 = 1 < (long)uVar117;
      uVar117 = uVar117 - 1;
    } while (bVar4);
    if (psVar107->infinity == 0) {
      uVar117 = (psVar107->z).n[0];
      uVar122 = (psVar107->z).n[1];
      uVar1 = (psVar107->z).n[2];
      uVar2 = (psVar107->z).n[3];
      uVar3 = (psVar107->z).n[4];
      auVar9._8_8_ = 0;
      auVar9._0_8_ = local_ce8._0_8_;
      auVar65._8_8_ = 0;
      auVar65._0_8_ = uVar2;
      auVar10._8_8_ = 0;
      auVar10._0_8_ = local_ce8._8_8_;
      auVar66._8_8_ = 0;
      auVar66._0_8_ = uVar1;
      auVar11._8_8_ = 0;
      auVar11._0_8_ = uStack_cd8;
      auVar67._8_8_ = 0;
      auVar67._0_8_ = uVar122;
      auVar12._8_8_ = 0;
      auVar12._0_8_ = local_cd0._0_8_;
      auVar68._8_8_ = 0;
      auVar68._0_8_ = uVar117;
      auVar13._8_8_ = 0;
      auVar13._0_8_ = local_cd0._8_8_;
      auVar69._8_8_ = 0;
      auVar69._0_8_ = uVar3;
      uVar113 = SUB168(auVar13 * auVar69,0);
      auVar14._8_8_ = 0;
      auVar14._0_8_ = uVar113 & 0xfffffffffffff;
      auVar127 = auVar10 * auVar66 + auVar9 * auVar65 + auVar11 * auVar67 + auVar12 * auVar68 +
                 auVar14 * ZEXT816(0x1000003d10);
      uVar115 = auVar127._0_8_;
      auVar98._8_8_ = 0;
      auVar98._0_8_ = uVar115 >> 0x34 | auVar127._8_8_ << 0xc;
      auVar15._8_8_ = 0;
      auVar15._0_8_ = local_ce8._0_8_;
      auVar70._8_8_ = 0;
      auVar70._0_8_ = uVar3;
      auVar16._8_8_ = 0;
      auVar16._0_8_ = local_ce8._8_8_;
      auVar71._8_8_ = 0;
      auVar71._0_8_ = uVar2;
      auVar17._8_8_ = 0;
      auVar17._0_8_ = uStack_cd8;
      auVar72._8_8_ = 0;
      auVar72._0_8_ = uVar1;
      auVar18._8_8_ = 0;
      auVar18._0_8_ = local_cd0._0_8_;
      auVar73._8_8_ = 0;
      auVar73._0_8_ = uVar122;
      auVar19._8_8_ = 0;
      auVar19._0_8_ = local_cd0._8_8_;
      auVar74._8_8_ = 0;
      auVar74._0_8_ = uVar117;
      auVar20._8_8_ = 0;
      auVar20._0_8_ = uVar113 >> 0x34 | SUB168(auVar13 * auVar69,8) << 0xc;
      auVar127 = auVar15 * auVar70 + auVar98 + auVar16 * auVar71 + auVar17 * auVar72 +
                 auVar18 * auVar73 + auVar19 * auVar74 + auVar20 * ZEXT816(0x1000003d10);
      uVar113 = auVar127._0_8_;
      auVar100._8_8_ = 0;
      auVar100._0_8_ = uVar113 >> 0x34 | auVar127._8_8_ << 0xc;
      auVar21._8_8_ = 0;
      auVar21._0_8_ = local_ce8._0_8_;
      auVar75._8_8_ = 0;
      auVar75._0_8_ = uVar117;
      auVar22._8_8_ = 0;
      auVar22._0_8_ = local_ce8._8_8_;
      auVar76._8_8_ = 0;
      auVar76._0_8_ = uVar3;
      auVar23._8_8_ = 0;
      auVar23._0_8_ = uStack_cd8;
      auVar77._8_8_ = 0;
      auVar77._0_8_ = uVar2;
      auVar24._8_8_ = 0;
      auVar24._0_8_ = local_cd0._0_8_;
      auVar78._8_8_ = 0;
      auVar78._0_8_ = uVar1;
      auVar25._8_8_ = 0;
      auVar25._0_8_ = local_cd0._8_8_;
      auVar79._8_8_ = 0;
      auVar79._0_8_ = uVar122;
      auVar127 = auVar22 * auVar76 + auVar100 + auVar23 * auVar77 + auVar24 * auVar78 +
                 auVar25 * auVar79;
      uVar116 = auVar127._0_8_;
      auVar102._8_8_ = 0;
      auVar102._0_8_ = uVar116 >> 0x34 | auVar127._8_8_ << 0xc;
      auVar80._8_8_ = 0;
      auVar80._0_8_ = (uVar116 & 0xfffffffffffff) << 4 | (uVar113 & 0xfffffffffffff) >> 0x30;
      uVar116 = auVar99._0_8_;
      auVar99 = auVar21 * auVar75 + ZEXT816(0x1000003d1) * auVar80;
      (psVar107->z).n[0] = uVar116 & 0xfffffffffffff;
      auVar101._8_8_ = 0;
      auVar101._0_8_ = uVar116 >> 0x34 | auVar99._8_8_ << 0xc;
      auVar26._8_8_ = 0;
      auVar26._0_8_ = local_ce8._0_8_;
      auVar81._8_8_ = 0;
      auVar81._0_8_ = uVar122;
      auVar27._8_8_ = 0;
      auVar27._0_8_ = local_ce8._8_8_;
      auVar82._8_8_ = 0;
      auVar82._0_8_ = uVar117;
      auVar28._8_8_ = 0;
      auVar28._0_8_ = uStack_cd8;
      auVar83._8_8_ = 0;
      auVar83._0_8_ = uVar3;
      auVar29._8_8_ = 0;
      auVar29._0_8_ = local_cd0._0_8_;
      auVar84._8_8_ = 0;
      auVar84._0_8_ = uVar2;
      auVar30._8_8_ = 0;
      auVar30._0_8_ = local_cd0._8_8_;
      auVar85._8_8_ = 0;
      auVar85._0_8_ = uVar1;
      auVar128 = auVar28 * auVar83 + auVar102 + auVar29 * auVar84 + auVar30 * auVar85;
      uVar116 = auVar128._0_8_;
      auVar31._8_8_ = 0;
      auVar31._0_8_ = uVar116 & 0xfffffffffffff;
      auVar127 = auVar26 * auVar81 + auVar101 + auVar27 * auVar82 + auVar31 * ZEXT816(0x1000003d10);
      uVar121 = auVar127._0_8_;
      auVar104._8_8_ = 0;
      auVar104._0_8_ = uVar116 >> 0x34 | auVar128._8_8_ << 0xc;
      (psVar107->z).n[1] = uVar121 & 0xfffffffffffff;
      auVar103._8_8_ = 0;
      auVar103._0_8_ = uVar121 >> 0x34 | auVar127._8_8_ << 0xc;
      auVar32._8_8_ = 0;
      auVar32._0_8_ = local_ce8._0_8_;
      auVar86._8_8_ = 0;
      auVar86._0_8_ = uVar1;
      auVar33._8_8_ = 0;
      auVar33._0_8_ = local_ce8._8_8_;
      auVar87._8_8_ = 0;
      auVar87._0_8_ = uVar122;
      auVar34._8_8_ = 0;
      auVar34._0_8_ = uStack_cd8;
      auVar88._8_8_ = 0;
      auVar88._0_8_ = uVar117;
      auVar35._8_8_ = 0;
      auVar35._0_8_ = local_cd0._0_8_;
      auVar89._8_8_ = 0;
      auVar89._0_8_ = uVar3;
      auVar36._8_8_ = 0;
      auVar36._0_8_ = local_cd0._8_8_;
      auVar90._8_8_ = 0;
      auVar90._0_8_ = uVar2;
      auVar128 = auVar35 * auVar89 + auVar104 + auVar36 * auVar90;
      uVar117 = auVar128._0_8_;
      auVar37._8_8_ = 0;
      auVar37._0_8_ = uVar117 & 0xfffffffffffff;
      auVar127 = auVar32 * auVar86 + auVar103 + auVar33 * auVar87 + auVar34 * auVar88 +
                 auVar37 * ZEXT816(0x1000003d10);
      uVar122 = auVar127._0_8_;
      (psVar107->z).n[2] = uVar122 & 0xfffffffffffff;
      auVar105._8_8_ = 0;
      auVar105._0_8_ = (uVar122 >> 0x34 | auVar127._8_8_ << 0xc) + (uVar115 & 0xfffffffffffff);
      auVar38._8_8_ = 0;
      auVar38._0_8_ = uVar117 >> 0x34 | auVar128._8_8_ << 0xc;
      auVar105 = auVar38 * ZEXT816(0x1000003d10) + auVar105;
      uVar117 = auVar105._0_8_;
      (psVar107->z).n[3] = uVar117 & 0xfffffffffffff;
      (psVar107->z).n[4] = (uVar117 >> 0x34 | auVar105._8_8_ << 0xc) + (uVar113 & 0xffffffffffff);
    }
  }
  return;
}

Assistant:

static void secp256k1_ecmult(secp256k1_gej *r, const secp256k1_gej *a, const secp256k1_scalar *na, const secp256k1_scalar *ng) {
    secp256k1_fe aux[ECMULT_TABLE_SIZE(WINDOW_A)];
    secp256k1_ge pre_a[ECMULT_TABLE_SIZE(WINDOW_A)];
    struct secp256k1_strauss_point_state ps[1];
    struct secp256k1_strauss_state state;

    state.aux = aux;
    state.pre_a = pre_a;
    state.ps = ps;
    secp256k1_ecmult_strauss_wnaf(&state, r, 1, a, na, ng);
}